

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_keypair_sec(secp256k1_context *ctx,uchar *seckey,secp256k1_keypair *keypair)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (seckey == (uchar *)0x0) {
    secp256k1_keypair_sec_cold_2();
  }
  else {
    seckey[0x10] = '\0';
    seckey[0x11] = '\0';
    seckey[0x12] = '\0';
    seckey[0x13] = '\0';
    seckey[0x14] = '\0';
    seckey[0x15] = '\0';
    seckey[0x16] = '\0';
    seckey[0x17] = '\0';
    seckey[0x18] = '\0';
    seckey[0x19] = '\0';
    seckey[0x1a] = '\0';
    seckey[0x1b] = '\0';
    seckey[0x1c] = '\0';
    seckey[0x1d] = '\0';
    seckey[0x1e] = '\0';
    seckey[0x1f] = '\0';
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    if (keypair != (secp256k1_keypair *)0x0) {
      uVar1 = *(undefined8 *)keypair->data;
      uVar2 = *(undefined8 *)(keypair->data + 8);
      uVar3 = *(undefined8 *)(keypair->data + 0x18);
      *(undefined8 *)(seckey + 0x10) = *(undefined8 *)(keypair->data + 0x10);
      *(undefined8 *)(seckey + 0x18) = uVar3;
      *(undefined8 *)seckey = uVar1;
      *(undefined8 *)(seckey + 8) = uVar2;
      return 1;
    }
    secp256k1_keypair_sec_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_keypair_sec(const secp256k1_context* ctx, unsigned char *seckey, const secp256k1_keypair *keypair) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    memset(seckey, 0, 32);
    ARG_CHECK(keypair != NULL);

    memcpy(seckey, &keypair->data[0], 32);
    return 1;
}